

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::Clear(Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  byte *pbVar1;
  OLECHAR *pOVar2;
  
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = 0;
  (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions = doAllowThreeByteSurrogates;
  this->m_fHadEol = 0;
  this->m_pchBase = (EncodedCharPtr)0x0;
  this->m_pchLast = (EncodedCharPtr)0x0;
  this->m_pchMinLine = (EncodedCharPtr)0x0;
  this->m_pchMinTok = (EncodedCharPtr)0x0;
  this->m_currentCharacter = (EncodedCharPtr)0x0;
  this->m_pchPrevLine = (EncodedCharPtr)0x0;
  this->m_cMinTokMultiUnits = 0;
  this->m_cMinLineMultiUnits = 0;
  this->m_fStringTemplateDepth = 0;
  this->field_0x508 = this->field_0x508 & 0x10;
  this->m_fYieldIsKeywordRegion = false;
  this->m_fAwaitIsKeywordRegion = false;
  this->m_pchStartLine = (EncodedCharPtr)0x0;
  this->m_line = 0;
  this->m_scanState = ScanStateNormal;
  this->m_ichMinError = 0;
  this->m_ichLimError = 0;
  this->m_startLine = 0;
  this->m_iecpLimTokPrevious = 0xffffffffffffffff;
  this->m_ichLimTokPrevious = 0xffffffff;
  pOVar2 = (this->m_tempChBuf).m_prgch;
  pbVar1 = (this->m_tempChBuf).m_rgbInit;
  if (pOVar2 != (OLECHAR *)pbVar1) {
    free(pOVar2);
    (this->m_tempChBuf).m_prgch = (OLECHAR *)pbVar1;
    (this->m_tempChBuf).m_cchMax = 0x80;
  }
  (this->m_tempChBuf).m_ichCur = 0;
  pOVar2 = (this->m_tempChBufSecondary).m_prgch;
  pbVar1 = (this->m_tempChBufSecondary).m_rgbInit;
  if (pOVar2 != (OLECHAR *)pbVar1) {
    free(pOVar2);
    (this->m_tempChBufSecondary).m_prgch = (OLECHAR *)pbVar1;
    (this->m_tempChBufSecondary).m_cchMax = 0x80;
  }
  (this->m_tempChBufSecondary).m_ichCur = 0;
  return;
}

Assistant:

void Scanner<EncodingPolicy>::Clear()
{
    EncodingPolicy::Clear();
    ClearStates();
    this->m_tempChBuf.Clear();
    this->m_tempChBufSecondary.Clear();
}